

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
slang::driver::Driver::runPreprocessor
          (Driver *this,bool includeComments,bool includeDirectives,bool obfuscateIds,
          bool useFixedObfuscationSeed)

{
  group_type_pointer pgVar1;
  int iVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  byte bVar6;
  string_view text;
  string_view text_00;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  __type_conflict3 _Var11;
  byte bVar12;
  uint uVar13;
  uint64_t uVar14;
  result_type rVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *hash;
  undefined7 in_register_00000009;
  long lVar16;
  ulong uVar17;
  pointer this_00;
  ulong uVar18;
  long lVar19;
  __extent_storage<18446744073709551615UL> args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ulong pos0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  string_view rawText;
  string_view fmt;
  string_view fmt_00;
  span<const_slang::Diagnostic,_18446744073709551615UL> diags;
  format_args args;
  format_args args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  char *pcVar22;
  undefined1 local_5429;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_5428;
  uint local_540c;
  flat_hash_map<std::string,_std::string> obfuscationMap;
  BumpAllocator alloc;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  SyntaxPrinter local_5348;
  Bag optionBag;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  random_device dev;
  string newName;
  array<unsigned_int,_1248UL> seed;
  uint local_13c8 [2];
  optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  rng;
  
  uVar17 = CONCAT71(in_register_00000009,obfuscateIds) & 0xffffffff;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map(&optionBag.items);
  addParseOptions(this,&optionBag);
  BumpAllocator::BumpAllocator(&alloc);
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len
       = 0;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap
       = 2;
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pcVar22 = (char *)0x0;
  args_1._M_extent_value = (size_t)&optionBag;
  parsing::Preprocessor::Preprocessor
            (&preprocessor,&this->sourceManager,&alloc,&diagnostics,(Bag *)args_1._M_extent_value,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  SourceLoader::loadSources(&buffers,&this->sourceLoader);
  for (; buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
         _M_impl.super__Vector_impl_data._M_finish !=
         buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
         _M_impl.super__Vector_impl_data._M_start;
      buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>._M_impl.
      super__Vector_impl_data._M_finish =
           buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1) {
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].data._M_len;
    pcVar22 = buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1].data._M_str;
    parsing::Preprocessor::pushSource
              (&preprocessor,
               buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]);
  }
  local_5348.buffer._M_dataplus._M_p = (pointer)&local_5348.buffer.field_2;
  local_5348.buffer._M_string_length = 0;
  local_5348.buffer.field_2._M_local_buf[0] = '\0';
  local_5348.sourceManager = (SourceManager *)0x0;
  local_5348.includeTrivia = true;
  local_5348.includeMissing = false;
  local_5348.includeSkipped = false;
  local_5348.includePreprocessed = true;
  local_5348.squashNewlines = true;
  rng.
  super__Optional_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  ._M_engaged = false;
  local_5348.includeDirectives = includeDirectives;
  local_5348.includeComments = includeComments;
  boost::unordered::
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_flat_map(&obfuscationMap);
  if ((char)uVar17 != '\0') {
    if (useFixedObfuscationSeed) {
      std::
      optional<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
      ::emplace<>(&rng);
    }
    else {
      memset(&seed,0,0x1380);
      std::random_device::random_device(&dev);
      std::ranges::__generate_n_fn::
      operator()<unsigned_int_*,_std::reference_wrapper<std::random_device>_>
                ((__generate_n_fn *)&std::ranges::generate_n,seed._M_elems,0x4e0,&dev);
      std::seed_seq::seed_seq<unsigned_int*>((seed_seq *)&local_5428,seed._M_elems,local_13c8);
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed<std::seed_seq>
                ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)&newName,(seed_seq *)&local_5428);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_5428);
      std::random_device::~random_device(&dev);
      bVar10 = rng.
               super__Optional_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
               ._M_engaged;
      memcpy(&rng,&newName,5000);
      if (bVar10 == false) {
        rng.
        super__Optional_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
        ._M_engaged = true;
      }
    }
  }
  local_540c = (uint)CONCAT71(in_register_00000009,obfuscateIds);
  do {
    local_5428._M_impl.super__Vector_impl_data._0_16_ = parsing::Preprocessor::next(&preprocessor);
    if ((TokenKind)local_5428._M_impl.super__Vector_impl_data._M_start == IntegerBase) {
      do {
        slang::syntax::SyntaxPrinter::print
                  (&local_5348,(Token)local_5428._M_impl.super__Vector_impl_data._0_16_);
        local_5428._M_impl.super__Vector_impl_data._0_16_ =
             parsing::Preprocessor::next(&preprocessor);
        bVar10 = slang::syntax::SyntaxFacts::isPossibleVectorDigit
                           ((TokenKind)local_5428._M_impl.super__Vector_impl_data._M_start);
      } while (bVar10);
    }
    if (((char)uVar17 != '\0') &&
       ((TokenKind)local_5428._M_impl.super__Vector_impl_data._M_start == Identifier)) {
      newName._0_16_ = parsing::Token::valueText((Token *)&local_5428);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&dev,(basic_string_view<char,_std::char_traits<char>_> *)&newName,
                 (allocator<char> *)&seed);
      uVar14 = detail::hashing::hash(dev.field_0.field_0._M_file,dev.field_0._M_mt._M_x[1]);
      uVar18 = uVar14 >> ((byte)obfuscationMap.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar19 = (uVar14 & 0xff) * 4;
      uVar3 = (&UNK_0040c7ac)[lVar19];
      uVar4 = (&UNK_0040c7ad)[lVar19];
      uVar5 = (&UNK_0040c7ae)[lVar19];
      bVar6 = (&UNK_0040c7af)[lVar19];
      uVar17 = 0;
      do {
        ppVar8 = obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.elements_;
        pgVar7 = obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.groups_;
        pgVar1 = obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.groups_ + uVar18;
        bVar12 = pgVar1->m[0xf].n;
        auVar20[0] = -(pgVar1->m[0].n == uVar3);
        auVar20[1] = -(pgVar1->m[1].n == uVar4);
        auVar20[2] = -(pgVar1->m[2].n == uVar5);
        auVar20[3] = -(pgVar1->m[3].n == bVar6);
        auVar20[4] = -(pgVar1->m[4].n == uVar3);
        auVar20[5] = -(pgVar1->m[5].n == uVar4);
        auVar20[6] = -(pgVar1->m[6].n == uVar5);
        auVar20[7] = -(pgVar1->m[7].n == bVar6);
        auVar20[8] = -(pgVar1->m[8].n == uVar3);
        auVar20[9] = -(pgVar1->m[9].n == uVar4);
        auVar20[10] = -(pgVar1->m[10].n == uVar5);
        auVar20[0xb] = -(pgVar1->m[0xb].n == bVar6);
        auVar20[0xc] = -(pgVar1->m[0xc].n == uVar3);
        auVar20[0xd] = -(pgVar1->m[0xd].n == uVar4);
        auVar20[0xe] = -(pgVar1->m[0xe].n == uVar5);
        auVar20[0xf] = -(bVar12 == bVar6);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          do {
            iVar2 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
              }
            }
            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&ppVar8[uVar18 * 0xf].first._M_dataplus._M_p + (ulong)(uint)(iVar2 << 6))
            ;
            _Var11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&dev,__rhs);
            if (_Var11) goto LAB_0017a06e;
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
          bVar12 = pgVar7[uVar18].m[0xf].n;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar14 & 7] & bVar12) == 0) break;
        lVar19 = uVar18 + uVar17;
        uVar17 = uVar17 + 1;
        uVar18 = lVar19 + 1U &
                 obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.groups_size_mask;
      } while (uVar17 <= obfuscationMap.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                         .arrays.groups_size_mask);
      newName._M_dataplus._M_p = (pointer)&newName.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&newName,0x10,'\0');
      _Var9._M_p = newName._M_dataplus._M_p;
      for (lVar19 = 0; lVar19 != 0x10; lVar19 = lVar19 + 1) {
        rVar15 = std::
                 mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                 ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)&rng);
        _Var9._M_p[lVar19] =
             "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar15 % 0x3e];
      }
      hash = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)&obfuscationMap,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dev)
      ;
      pos0 = (ulong)hash >>
             ((byte)obfuscationMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                    .arrays.groups_size_index & 0x3f);
      lVar19 = ((ulong)hash & 0xff) * 4;
      uVar3 = (&UNK_0040c7ac)[lVar19];
      uVar4 = (&UNK_0040c7ad)[lVar19];
      uVar5 = (&UNK_0040c7ae)[lVar19];
      bVar6 = (&UNK_0040c7af)[lVar19];
      uVar18 = 0;
      uVar17 = pos0;
      do {
        ppVar8 = obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.elements_;
        pgVar7 = obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.groups_;
        pgVar1 = obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.groups_ + uVar17;
        bVar12 = pgVar1->m[0xf].n;
        auVar21[0] = -(pgVar1->m[0].n == uVar3);
        auVar21[1] = -(pgVar1->m[1].n == uVar4);
        auVar21[2] = -(pgVar1->m[2].n == uVar5);
        auVar21[3] = -(pgVar1->m[3].n == bVar6);
        auVar21[4] = -(pgVar1->m[4].n == uVar3);
        auVar21[5] = -(pgVar1->m[5].n == uVar4);
        auVar21[6] = -(pgVar1->m[6].n == uVar5);
        auVar21[7] = -(pgVar1->m[7].n == bVar6);
        auVar21[8] = -(pgVar1->m[8].n == uVar3);
        auVar21[9] = -(pgVar1->m[9].n == uVar4);
        auVar21[10] = -(pgVar1->m[10].n == uVar5);
        auVar21[0xb] = -(pgVar1->m[0xb].n == bVar6);
        auVar21[0xc] = -(pgVar1->m[0xc].n == uVar3);
        auVar21[0xd] = -(pgVar1->m[0xd].n == uVar4);
        auVar21[0xe] = -(pgVar1->m[0xe].n == uVar5);
        auVar21[0xf] = -(bVar12 == bVar6);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
        args_1._M_extent_value = (size_t)hash;
        if (uVar13 != 0) {
          do {
            iVar2 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
              }
            }
            __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&ppVar8[uVar17 * 0xf].first._M_dataplus._M_p + (ulong)(uint)(iVar2 << 6))
            ;
            _Var11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&dev,__rhs);
            if (_Var11) goto LAB_0017a061;
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
          bVar12 = pgVar7[uVar17].m[0xf].n;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar12) == 0) break;
        lVar19 = uVar17 + uVar18;
        uVar18 = uVar18 + 1;
        uVar17 = lVar19 + 1U &
                 obfuscationMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                 .arrays.groups_size_mask;
      } while (uVar18 <= obfuscationMap.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
                         .arrays.groups_size_mask);
      if (obfuscationMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
          .size_ctrl.size <
          obfuscationMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>_>
          .size_ctrl.ml) {
        args_2 = &newName;
        args_1._M_extent_value = (size_t)&local_5429;
        in_R9.values_ = (value<fmt::v11::context> *)&dev;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                  ((locator *)&seed,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&obfuscationMap,pos0,(size_t)hash,(try_emplace_args_t *)args_1._M_extent_value
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_R9.values_,args_2);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                seed._M_elems._16_8_;
      }
      else {
        args_1._M_extent_value = (size_t)&dev;
        in_R9.values_ = (value<fmt::v11::context> *)&newName;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::__cxx11::string&>
                  ((locator *)&seed,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&obfuscationMap,(size_t)hash,(try_emplace_args_t *)&local_5429,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   args_1._M_extent_value,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_R9.values_);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                seed._M_elems._16_8_;
      }
LAB_0017a061:
      std::__cxx11::string::~string((string *)&newName);
LAB_0017a06e:
      rawText._M_str = __rhs[1]._M_dataplus._M_p;
      rawText._M_len = __rhs[1]._M_string_length;
      local_5428._M_impl.super__Vector_impl_data._0_16_ =
           parsing::Token::withRawText((Token *)&local_5428,&alloc,rawText);
      std::__cxx11::string::~string((string *)&dev);
      uVar17 = (ulong)local_540c;
    }
    slang::syntax::SyntaxPrinter::print
              (&local_5348,(Token)local_5428._M_impl.super__Vector_impl_data._0_16_);
  } while ((TokenKind)local_5428._M_impl.super__Vector_impl_data._M_start != EndOfFile);
  lVar19 = diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
           super_SmallVectorBase<slang::Diagnostic>.len * 0x70;
  this_00 = diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
            super_SmallVectorBase<slang::Diagnostic>.data_;
  do {
    lVar16 = lVar19;
    if (lVar16 == 0) {
      std::__cxx11::string::string((string *)&newName,&local_5348.buffer);
      auVar20 = (undefined1  [16])newName._0_16_;
      seed._M_elems._0_8_ = newName._M_dataplus._M_p;
      seed._M_elems[2] = (undefined4)newName._M_string_length;
      seed._M_elems[3] = newName._M_string_length._4_4_;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x3;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&seed;
      newName._0_16_ = auVar20;
      ::fmt::v11::vformat_abi_cxx11_((string *)&dev,(v11 *)0x40eba7,fmt_00,args_00);
      text_00._M_str = pcVar22;
      text_00._M_len = (size_t)args_2;
      OS::print(text_00);
      goto LAB_0017a1fd;
    }
    bVar10 = Diagnostic::isError(this_00);
    this_00 = this_00 + 1;
    lVar19 = lVar16 + -0x70;
  } while (!bVar10);
  diags._M_extent._M_extent_value = args_1._M_extent_value;
  diags._M_ptr = (pointer)diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                          super_SmallVectorBase<slang::Diagnostic>.len;
  DiagnosticEngine::reportAll_abi_cxx11_
            (&newName,(DiagnosticEngine *)&this->sourceManager,
             (SourceManager *)
             diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.data_,diags);
  auVar20 = (undefined1  [16])newName._0_16_;
  seed._M_elems._0_8_ = newName._M_dataplus._M_p;
  seed._M_elems[2] = (undefined4)newName._M_string_length;
  seed._M_elems[3] = newName._M_string_length._4_4_;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x2;
  args.field_1.values_ = in_R9.values_;
  args.desc_ = (unsigned_long_long)&seed;
  newName._0_16_ = auVar20;
  ::fmt::v11::vformat_abi_cxx11_((string *)&dev,(v11 *)0x432add,fmt,args);
  text._M_str = pcVar22;
  text._M_len = (size_t)args_2;
  OS::printE(text);
LAB_0017a1fd:
  std::__cxx11::string::~string((string *)&dev);
  std::__cxx11::string::~string((string *)&newName);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&obfuscationMap);
  std::__cxx11::string::~string((string *)&local_5348);
  std::_Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::~_Vector_base
            (&buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>)
  ;
  parsing::Preprocessor::~Preprocessor(&preprocessor);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&diagnostics,
             (EVP_PKEY_CTX *)dev.field_0.field_0._M_file);
  BumpAllocator::~BumpAllocator(&alloc);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&optionBag);
  return lVar16 == 0;
}

Assistant:

bool Driver::runPreprocessor(bool includeComments, bool includeDirectives, bool obfuscateIds,
                             bool useFixedObfuscationSeed) {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    SyntaxPrinter output;
    output.setIncludeComments(includeComments);
    output.setIncludeDirectives(includeDirectives);

    std::optional<std::mt19937> rng;
    flat_hash_map<std::string, std::string> obfuscationMap;

    if (obfuscateIds) {
        if (useFixedObfuscationSeed)
            rng.emplace();
        else
            rng = createRandomGenerator<std::mt19937>();
    }

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::IntegerBase) {
            // This is needed for the case where obfuscation is enabled,
            // the digits of a vector literal may be lexed initially as
            // an identifier and we don't have the parser here to fix things
            // up for us.
            do {
                output.print(token);
                token = preprocessor.next();
            } while (SyntaxFacts::isPossibleVectorDigit(token.kind));
        }

        if (obfuscateIds && token.kind == TokenKind::Identifier) {
            auto name = std::string(token.valueText());
            auto translation = obfuscationMap.find(name);
            if (translation == obfuscationMap.end()) {
                auto newName = generateRandomAlphanumericString(*rng, 16);
                translation = obfuscationMap.emplace(name, newName).first;
            }
            token = token.withRawText(alloc, translation->second);
        }

        output.print(token);
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    // Only print diagnostics if actual errors occurred.
    for (auto& diag : diagnostics) {
        if (diag.isError()) {
            OS::printE(fmt::format("{}", DiagnosticEngine::reportAll(sourceManager, diagnostics)));
            return false;
        }
    }

    OS::print(fmt::format("{}\n", output.str()));
    return true;
}